

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O1

bool __thiscall
bssl::anon_unknown_20::AppendHashAsOctetString
          (anon_unknown_20 *this,EVP_MD *hash_type,CBB *cbb,Input value)

{
  int iVar1;
  uint hash_len;
  CBB octet_string;
  uint8_t hash_buffer [64];
  uint local_9c;
  CBB local_98;
  uchar local_68 [72];
  
  iVar1 = CBB_add_asn1((CBB *)hash_type,&local_98,4);
  if (iVar1 != 0) {
    iVar1 = EVP_Digest(cbb,(size_t)value.data_.data_,local_68,&local_9c,(EVP_MD *)this,(ENGINE *)0x0
                      );
    if (iVar1 != 0) {
      iVar1 = CBB_add_bytes(&local_98,local_68,(ulong)local_9c);
      if (iVar1 != 0) {
        iVar1 = CBB_flush((CBB *)hash_type);
      }
    }
  }
  return SUB41(iVar1,0);
}

Assistant:

bool AppendHashAsOctetString(const EVP_MD *hash_type, CBB *cbb,
                             der::Input value) {
  CBB octet_string;
  unsigned hash_len;
  uint8_t hash_buffer[EVP_MAX_MD_SIZE];

  return CBB_add_asn1(cbb, &octet_string, CBS_ASN1_OCTETSTRING) &&
         EVP_Digest(value.data(), value.size(), hash_buffer, &hash_len,
                    hash_type, nullptr) &&
         CBB_add_bytes(&octet_string, hash_buffer, hash_len) && CBB_flush(cbb);
}